

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O3

void blitXor(Span *spans,int count,uint8_t *buffer,int offsetX)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  
  if (count != 0) {
    do {
      uVar1 = spans->len;
      if (uVar1 != 0) {
        iVar3 = spans->x + offsetX;
        lVar2 = 0;
        do {
          uVar4 = (buffer[lVar2 + iVar3] ^ 0xff) * (uint)spans->coverage +
                  (spans->coverage ^ 0xff) * (uint)buffer[lVar2 + iVar3];
          buffer[lVar2 + iVar3] = (uint8_t)((uVar4 >> 8) + uVar4 + 0x80 >> 8);
          lVar2 = lVar2 + 1;
        } while ((uint)uVar1 != (uint)lVar2);
      }
      count = count + -1;
      spans = spans + 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void blitXor(VRle::Span *spans, int count, uint8_t *buffer, int offsetX)
{
    while (count--) {
        int    x = spans->x + offsetX;
        int    l = spans->len;
        uint8_t *ptr = buffer + x;
        while (l--) {
            int da = *ptr;
            *ptr = divBy255((255 - spans->coverage) * (da) +
                            spans->coverage * (255 - da));
            ptr++;
        }
        spans++;
    }
}